

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall QtPrivate::QGenericArrayOps<QString>::eraseLast(QGenericArrayOps<QString> *this)

{
  QArrayDataPointer<QString> *in_RDI;
  
  QArrayDataPointer<QString>::end(in_RDI);
  QString::~QString((QString *)0x7ce2d8);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }